

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

void __thiscall dg::vr::AllocatedArea::AllocatedArea(AllocatedArea *this,CallInst *call)

{
  long lVar1;
  uint64_t uVar2;
  AllocationFunction AVar3;
  uint64_t *puVar4;
  AnalysisOptions options;
  string sStack_78;
  AnalysisOptions local_58;
  
  this->ptr = (Value *)call;
  this->reallocatedPtr = (Value *)0x0;
  (this->originalSizeView).elementCount = (Value *)0x0;
  (this->originalSizeView).elementSize = 0;
  llvm::CallBase::getCalledFunction((CallBase *)call);
  local_58._0_16_ = llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(&sStack_78,(StringRef *)&local_58);
  AnalysisOptions::AnalysisOptions(&local_58);
  AVar3 = AnalysisOptions::getAllocationFunction(&local_58,&sStack_78);
  if (AVar3 != ALLOCA) {
    AVar3 = AnalysisOptions::getAllocationFunction(&local_58,&sStack_78);
    if (AVar3 != MALLOC) goto LAB_0013abf0;
  }
  (this->originalSizeView).elementCount =
       *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
  (this->originalSizeView).elementSize = 1;
LAB_0013abf0:
  AVar3 = AnalysisOptions::getAllocationFunction(&local_58,&sStack_78);
  if (AVar3 == CALLOC) {
    lVar1 = *(long *)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5) + 0x20);
    if (*(uint *)(lVar1 + 0x20) < 0x41) {
      puVar4 = (uint64_t *)(lVar1 + 0x18);
    }
    else {
      puVar4 = *(uint64_t **)(lVar1 + 0x18);
    }
    uVar2 = *puVar4;
    (this->originalSizeView).elementCount =
         *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
    (this->originalSizeView).elementSize = uVar2;
  }
  AVar3 = AnalysisOptions::getAllocationFunction(&local_58,&sStack_78);
  if (AVar3 == REALLOC) {
    (this->originalSizeView).elementCount =
         *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
    (this->originalSizeView).elementSize = 1;
    this->reallocatedPtr = *(Value **)(call + -(ulong)(uint)(*(int *)(call + 0x14) << 5));
  }
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::~_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
               *)((long)&local_58 + 8));
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

AllocatedArea::AllocatedArea(const llvm::CallInst *call) : ptr(call) {
    const std::string &name = call->getCalledFunction()->getName().str();
    AnalysisOptions options;

    if (options.getAllocationFunction(name) == AllocationFunction::ALLOCA ||
        options.getAllocationFunction(name) == AllocationFunction::MALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
    }

    if (options.getAllocationFunction(name) == AllocationFunction::CALLOC) {
        const auto *size = llvm::cast<llvm::ConstantInt>(call->getOperand(1));
        originalSizeView =
                AllocatedSizeView(call->getOperand(0), size->getZExtValue());
    }

    if (options.getAllocationFunction(name) == AllocationFunction::REALLOC) {
        originalSizeView = AllocatedSizeView(call->getOperand(0), 1);
        reallocatedPtr = call->getOperand(0);
    }
}